

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_serialize_tofile(FILE *out)

{
  uint8_t *puVar1;
  size_t sVar2;
  avl_iter_t *iter;
  lddmc_ser *plVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  mddnode node;
  long local_38;
  
  sVar2 = avl_count(lddmc_ser_reversed_set);
  local_38 = sVar2 - lddmc_ser_done;
  if (sVar2 < lddmc_ser_done) {
    __assert_fail("count >= lddmc_ser_done",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                  ,0x9f2,"void lddmc_serialize_tofile(FILE *)");
  }
  if (sVar2 == lddmc_ser_counter - 2) {
    fwrite(&local_38,8,1,(FILE *)out);
    iter = avl_iter(lddmc_ser_reversed_set);
    sVar2 = lddmc_ser_done;
    sVar7 = 0;
    while ((sVar4 = sVar2, sVar2 != sVar7 &&
           (plVar3 = lddmc_ser_reversed_iter_next(iter), sVar4 = sVar7, plVar3 != (lddmc_ser *)0x0))
          ) {
      if (sVar7 + 2 != plVar3->assigned) {
        __assert_fail("s->assigned == index+2",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x9fd,"void lddmc_serialize_tofile(FILE *)");
      }
      sVar7 = sVar7 + 1;
    }
    uVar5 = sVar4 + 1;
    while( true ) {
      plVar3 = lddmc_ser_reversed_iter_next(iter);
      if (plVar3 == (lddmc_ser *)0x0) {
        lddmc_ser_done = lddmc_ser_counter - 2;
        free(iter);
        return;
      }
      if (uVar5 + 1 != plVar3->assigned) break;
      lVar6 = plVar3->mdd * 0x10;
      puVar1 = nodes->data;
      sVar2 = lddmc_serialize_get(*(ulong *)(puVar1 + lVar6) >> 1 & 0x7fffffffffff);
      sVar7 = lddmc_serialize_get(*(ulong *)(puVar1 + lVar6 + 8) >> 0x11);
      if ((puVar1[lVar6 + 10] & 1) == 0) {
        node.a._0_6_ = (int6)sVar2 * 2;
        node.b._2_6_ = (uint6)((sVar7 << 0x11) >> 0x10);
        node.a._6_2_ = (undefined2)*(undefined4 *)(puVar1 + lVar6 + 6);
        node.b._0_2_ = (undefined2)((uint)*(undefined4 *)(puVar1 + lVar6 + 6) >> 0x10);
      }
      else {
        node.b._2_6_ = (uint6)((sVar7 << 0x11) >> 0x10) | 1;
        node.a._0_6_ = (int6)(sVar2 * 2);
        node.a._6_2_ = (undefined2)(sVar2 * 2 >> 0x30);
        node.b._0_2_ = 0;
      }
      if (uVar5 < sVar2) {
        __assert_fail("right <= index",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0xa0d,"void lddmc_serialize_tofile(FILE *)");
      }
      if (uVar5 < sVar7) {
        __assert_fail("down <= index",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0xa0e,"void lddmc_serialize_tofile(FILE *)");
      }
      fwrite(&node,0x10,1,(FILE *)out);
      uVar5 = uVar5 + 1;
    }
    __assert_fail("s->assigned == index+2",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                  ,0xa02,"void lddmc_serialize_tofile(FILE *)");
  }
  __assert_fail("count == lddmc_ser_counter-2",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                ,0x9f3,"void lddmc_serialize_tofile(FILE *)");
}

Assistant:

void
lddmc_serialize_tofile(FILE *out)
{
    size_t count = avl_count(lddmc_ser_reversed_set);
    assert(count >= lddmc_ser_done);
    assert(count == lddmc_ser_counter-2);
    count -= lddmc_ser_done;
    fwrite(&count, sizeof(size_t), 1, out);

    struct lddmc_ser *s;
    avl_iter_t *it = lddmc_ser_reversed_iter(lddmc_ser_reversed_set);

    /* Skip already written entries */
    size_t index = 0;
    while (index < lddmc_ser_done && (s=lddmc_ser_reversed_iter_next(it))) {
        assert(s->assigned == index+2);
        index++;
    }

    while ((s=lddmc_ser_reversed_iter_next(it))) {
        assert(s->assigned == index+2);
        index++;

        mddnode_t n = LDD_GETNODE(s->mdd);

        struct mddnode node;
        uint64_t right = lddmc_serialize_get(mddnode_getright(n));
        uint64_t down = lddmc_serialize_get(mddnode_getdown(n));
        if (mddnode_getcopy(n)) mddnode_makecopy(&node, right, down);
        else mddnode_make(&node, mddnode_getvalue(n), right, down);

        assert(right <= index);
        assert(down <= index);

        fwrite(&node, sizeof(struct mddnode), 1, out);
    }

    lddmc_ser_done = lddmc_ser_counter-2;
    lddmc_ser_reversed_iter_free(it);
}